

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

void StoreHuffmanCode(VP8LBitWriter *bw,HuffmanTree *huff_tree,HuffmanTreeToken *tokens,
                     HuffmanTreeCode *huffman_code)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  uint8_t *puVar4;
  bool bVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  vp8l_atype_t vVar18;
  int symbols [2];
  HuffmanTreeCode huffman_code_1;
  uint8_t code_length_bitdepth [19];
  uint32_t histogram [19];
  uint16_t code_length_bitdepth_symbols [19];
  undefined8 local_108;
  HuffmanTreeCode local_100;
  byte local_e8 [32];
  uint8_t local_c8 [32];
  uint32_t local_a8 [20];
  uint16_t local_58 [20];
  
  local_108 = 0;
  iVar10 = huffman_code->num_symbols;
  if (0 < (long)iVar10) {
    puVar4 = huffman_code->code_lengths;
    uVar11 = 0;
    iVar15 = 0;
    do {
      if (puVar4[uVar11] != '\0') {
        if (iVar15 < 2) {
          *(int *)((long)&local_108 + (long)iVar15 * 4) = (int)uVar11;
        }
        iVar15 = iVar15 + 1;
      }
      uVar11 = uVar11 + 1;
    } while ((uVar11 < (ulong)(long)iVar10) && (iVar15 < 3));
    if (iVar15 != 0) {
      iVar6 = (int)local_108;
      uVar8 = local_108._4_4_;
      if (0xff < (int)local_108._4_4_ || (0xff < (int)local_108 || 2 < iVar15)) {
        local_100.code_lengths = local_e8;
        local_e8[0] = 0;
        local_e8[1] = 0;
        local_e8[2] = 0;
        local_e8[3] = 0;
        local_e8[4] = 0;
        local_e8[5] = 0;
        local_e8[6] = 0;
        local_e8[7] = 0;
        local_e8[8] = 0;
        local_e8[9] = 0;
        local_e8[10] = 0;
        local_e8[0xb] = 0;
        local_e8[0xc] = 0;
        local_e8[0xd] = 0;
        local_e8[0xe] = 0;
        local_e8[0xf] = 0;
        local_e8[0x10] = 0;
        local_e8[0x11] = 0;
        local_e8[0x12] = 0;
        local_100.codes = local_58;
        local_58[8] = 0;
        local_58[9] = 0;
        local_58[10] = 0;
        local_58[0xb] = 0;
        local_58[0xc] = 0;
        local_58[0xd] = 0;
        local_58[0xe] = 0;
        local_58[0] = 0;
        local_58[1] = 0;
        local_58[2] = 0;
        local_58[3] = 0;
        local_58[4] = 0;
        local_58[5] = 0;
        local_58[6] = 0;
        local_58[7] = 0;
        local_58[0xf] = 0;
        local_58[0x10] = 0;
        local_58[0x11] = 0;
        local_58[0x12] = 0;
        local_100.num_symbols = 0x13;
        iVar15 = bw->used;
        if (0x1f < iVar15) {
          VP8LPutBitsFlushBits(bw);
          iVar15 = bw->used;
        }
        bw->used = iVar15 + 1;
        uVar8 = VP8LCreateCompressedHuffmanTree(huffman_code,tokens,iVar10);
        local_a8[0x10] = 0;
        local_a8[0x11] = 0;
        local_a8[0x12] = 0;
        local_a8[0xc] = 0;
        local_a8[0xd] = 0;
        local_a8[0xe] = 0;
        local_a8[0xf] = 0;
        local_a8[8] = 0;
        local_a8[9] = 0;
        local_a8[10] = 0;
        local_a8[0xb] = 0;
        local_a8[4] = 0;
        local_a8[5] = 0;
        local_a8[6] = 0;
        local_a8[7] = 0;
        local_a8[0] = 0;
        local_a8[1] = 0;
        local_a8[2] = 0;
        local_a8[3] = 0;
        local_c8[0] = '\0';
        local_c8[1] = '\0';
        local_c8[2] = '\0';
        local_c8[3] = '\0';
        local_c8[4] = '\0';
        local_c8[5] = '\0';
        local_c8[6] = '\0';
        local_c8[7] = '\0';
        local_c8[8] = '\0';
        local_c8[9] = '\0';
        local_c8[10] = '\0';
        local_c8[0xb] = '\0';
        local_c8[0xc] = '\0';
        local_c8[0xd] = '\0';
        local_c8[0xe] = '\0';
        local_c8[0xf] = '\0';
        local_c8[0x10] = '\0';
        local_c8[0x11] = '\0';
        local_c8[0x12] = '\0';
        uVar11 = (ulong)uVar8;
        if (0 < (int)uVar8) {
          uVar13 = 0;
          do {
            local_a8[tokens[uVar13].code] = local_a8[tokens[uVar13].code] + 1;
            uVar13 = uVar13 + 1;
          } while (uVar11 != uVar13);
        }
        VP8LCreateHuffmanTree(local_a8,7,local_c8,huff_tree,&local_100);
        uVar13 = 0x13;
        uVar17 = 0x14;
        do {
          if (uVar13 < 5) {
            uVar17 = 4;
            break;
          }
          pbVar1 = &UNK_001b699f + uVar13;
          uVar13 = uVar13 - 1;
          uVar17 = uVar17 - 1;
        } while (local_e8[*pbVar1] == 0);
        iVar10 = bw->used;
        if (0x1f < iVar10) {
          VP8LPutBitsFlushBits(bw);
          iVar10 = bw->used;
        }
        uVar13 = (ulong)(uVar17 - 4) << ((byte)iVar10 & 0x3f) | bw->bits;
        bw->bits = uVar13;
        iVar10 = iVar10 + 4;
        bw->used = iVar10;
        if (0 < (int)uVar17) {
          uVar16 = 0;
          do {
            bVar14 = local_e8[(byte)(&StoreHuffmanTreeOfHuffmanTreeToBitMask_kStorageOrder)[uVar16]]
            ;
            if (0x1f < iVar10) {
              VP8LPutBitsFlushBits(bw);
              iVar10 = bw->used;
              uVar13 = bw->bits;
            }
            uVar13 = uVar13 | (ulong)bVar14 << ((byte)iVar10 & 0x3f);
            bw->bits = uVar13;
            iVar10 = iVar10 + 3;
            bw->used = iVar10;
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
        }
        if (0 < (long)local_100.num_symbols) {
          lVar12 = 0;
          bVar5 = false;
          do {
            bVar7 = bVar5;
            if ((local_100.code_lengths[lVar12] != 0) && (bVar7 = true, bVar5)) goto LAB_0013f0de;
            bVar5 = bVar7;
            lVar12 = lVar12 + 1;
          } while (local_100.num_symbols != lVar12);
          lVar12 = 0;
          do {
            local_100.code_lengths[lVar12] = 0;
            local_100.codes[lVar12] = 0;
            lVar12 = lVar12 + 1;
          } while (lVar12 < local_100.num_symbols);
        }
LAB_0013f0de:
        uVar9 = 0;
        uVar17 = uVar8;
        if (0 < (int)uVar8) {
          do {
            bVar14 = tokens[uVar11 - 1].code;
            if ((0x12 < bVar14) || ((0x60001U >> (bVar14 & 0x1f) & 1) == 0)) goto LAB_0013f129;
            uVar9 = uVar9 + local_e8[bVar14];
            if ((ulong)bVar14 == 0x12) {
              uVar9 = uVar9 + 7;
            }
            else if (bVar14 == 0x11) {
              uVar9 = uVar9 + 3;
            }
            bVar5 = 1 < uVar11;
            uVar11 = uVar11 - 1;
          } while (bVar5);
          uVar11 = 0;
LAB_0013f129:
          uVar9 = (uint)(0xc < (int)uVar9);
          uVar17 = (uint)uVar11;
        }
        bVar14 = 1 < (int)uVar17 & (byte)uVar9;
        iVar10 = bw->used;
        if (0x1f < iVar10) {
          VP8LPutBitsFlushBits(bw);
          iVar10 = bw->used;
        }
        uVar11 = (ulong)bVar14 << ((byte)iVar10 & 0x3f) | bw->bits;
        bw->bits = uVar11;
        iVar15 = iVar10 + 1;
        bw->used = iVar15;
        if (bVar14 == 0) {
          if ((int)uVar8 < 1) {
            return;
          }
        }
        else {
          if (uVar17 == 2) {
            if (0x1e < iVar10) {
              VP8LPutBitsFlushBits(bw);
              iVar15 = bw->used;
            }
            iVar15 = iVar15 + 5;
          }
          else {
            uVar9 = uVar17 - 2;
            uVar8 = 0x1f;
            if (uVar9 != 0) {
              for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            if (0x1e < iVar10) {
              VP8LPutBitsFlushBits(bw);
              iVar15 = bw->used;
              uVar11 = bw->bits;
            }
            uVar11 = (ulong)(uVar8 >> 1) << ((byte)iVar15 & 0x3f) | uVar11;
            bw->bits = uVar11;
            iVar10 = iVar15 + 3;
            bw->used = iVar10;
            if (0x1c < iVar15) {
              VP8LPutBitsFlushBits(bw);
              iVar10 = bw->used;
              uVar11 = bw->bits;
            }
            bw->bits = (ulong)uVar9 << ((byte)iVar10 & 0x3f) | uVar11;
            iVar15 = (uVar8 & 0x1e) + 2 + iVar10;
          }
          bw->used = iVar15;
          uVar8 = uVar17;
        }
        uVar11 = 0;
        do {
          bVar14 = tokens[uVar11].code;
          uVar13 = (ulong)tokens[uVar11].extra_bits;
          bVar2 = local_100.code_lengths[bVar14];
          if (bVar2 != 0) {
            uVar3 = local_100.codes[bVar14];
            if (0x1f < iVar15) {
              VP8LPutBitsFlushBits(bw);
              iVar15 = bw->used;
            }
            bw->bits = bw->bits | (ulong)uVar3 << ((byte)iVar15 & 0x3f);
            iVar15 = iVar15 + (uint)bVar2;
            bw->used = iVar15;
          }
          if (bVar14 == 0x12) {
            if (0x1f < iVar15) {
              VP8LPutBitsFlushBits(bw);
              iVar15 = bw->used;
            }
            bw->bits = bw->bits | uVar13 << ((byte)iVar15 & 0x3f);
            iVar15 = iVar15 + 7;
LAB_0013f31d:
            bw->used = iVar15;
          }
          else {
            if (bVar14 == 0x11) {
              if (0x1f < iVar15) {
                VP8LPutBitsFlushBits(bw);
                iVar15 = bw->used;
              }
              bw->bits = bw->bits | uVar13 << ((byte)iVar15 & 0x3f);
              iVar15 = iVar15 + 3;
              goto LAB_0013f31d;
            }
            if (bVar14 == 0x10) {
              if (0x1f < iVar15) {
                VP8LPutBitsFlushBits(bw);
                iVar15 = bw->used;
              }
              bw->bits = bw->bits | uVar13 << ((byte)iVar15 & 0x3f);
              iVar15 = iVar15 + 2;
              goto LAB_0013f31d;
            }
          }
          uVar11 = uVar11 + 1;
          if (uVar8 == uVar11) {
            return;
          }
        } while( true );
      }
      uVar11 = local_108 & 0xffffffff;
      uVar17 = bw->used;
      if (0x1f < (int)uVar17) {
        VP8LPutBitsFlushBits(bw);
        uVar17 = bw->used;
      }
      uVar13 = bw->bits | 1L << ((ulong)uVar17 & 0x3f);
      bw->bits = uVar13;
      iVar10 = uVar17 + 1;
      bw->used = iVar10;
      if (0x1e < (int)uVar17) {
        VP8LPutBitsFlushBits(bw);
        iVar10 = bw->used;
        uVar13 = bw->bits;
      }
      uVar13 = (ulong)(iVar15 - 1) << ((byte)iVar10 & 0x3f) | uVar13;
      bw->bits = uVar13;
      uVar17 = iVar10 + 1;
      bw->used = uVar17;
      if (iVar6 < 2) {
        if (0x1e < iVar10) {
          VP8LPutBitsFlushBits(bw);
          uVar17 = bw->used;
        }
        iVar10 = uVar17 + 1;
        bw->used = iVar10;
        if (0x1e < (int)uVar17) {
          VP8LPutBitsFlushBits(bw);
          iVar10 = bw->used;
        }
        vVar18 = uVar11 << ((byte)iVar10 & 0x3f) | bw->bits;
        bw->bits = vVar18;
        iVar10 = iVar10 + 1;
      }
      else {
        if (0x1e < iVar10) {
          VP8LPutBitsFlushBits(bw);
          uVar17 = bw->used;
          uVar13 = bw->bits;
        }
        uVar13 = uVar13 | 1L << ((ulong)uVar17 & 0x3f);
        bw->bits = uVar13;
        iVar10 = uVar17 + 1;
        bw->used = iVar10;
        if (0x1e < (int)uVar17) {
          VP8LPutBitsFlushBits(bw);
          iVar10 = bw->used;
          uVar13 = bw->bits;
        }
        vVar18 = uVar11 << ((byte)iVar10 & 0x3f) | uVar13;
        bw->bits = vVar18;
        iVar10 = iVar10 + 8;
      }
      bw->used = iVar10;
      if (iVar15 != 2) {
        return;
      }
      if (0x1f < iVar10) {
        VP8LPutBitsFlushBits(bw);
        iVar10 = bw->used;
        vVar18 = bw->bits;
      }
      bw->bits = (ulong)uVar8 << ((byte)iVar10 & 0x3f) | vVar18;
      iVar10 = iVar10 + 8;
      goto LAB_0013ef04;
    }
  }
  iVar10 = bw->used;
  if (0x1f < iVar10) {
    VP8LPutBitsFlushBits(bw);
    iVar10 = bw->used;
  }
  bw->bits = bw->bits | 1L << ((byte)iVar10 & 0x3f);
  iVar10 = iVar10 + 4;
LAB_0013ef04:
  bw->used = iVar10;
  return;
}

Assistant:

static void StoreHuffmanCode(VP8LBitWriter* const bw,
                             HuffmanTree* const huff_tree,
                             HuffmanTreeToken* const tokens,
                             const HuffmanTreeCode* const huffman_code) {
  int i;
  int count = 0;
  int symbols[2] = { 0, 0 };
  const int kMaxBits = 8;
  const int kMaxSymbol = 1 << kMaxBits;

  // Check whether it's a small tree.
  for (i = 0; i < huffman_code->num_symbols && count < 3; ++i) {
    if (huffman_code->code_lengths[i] != 0) {
      if (count < 2) symbols[count] = i;
      ++count;
    }
  }

  if (count == 0) {   // emit minimal tree for empty cases
    // bits: small tree marker: 1, count-1: 0, large 8-bit code: 0, code: 0
    VP8LPutBits(bw, 0x01, 4);
  } else if (count <= 2 && symbols[0] < kMaxSymbol && symbols[1] < kMaxSymbol) {
    VP8LPutBits(bw, 1, 1);  // Small tree marker to encode 1 or 2 symbols.
    VP8LPutBits(bw, count - 1, 1);
    if (symbols[0] <= 1) {
      VP8LPutBits(bw, 0, 1);  // Code bit for small (1 bit) symbol value.
      VP8LPutBits(bw, symbols[0], 1);
    } else {
      VP8LPutBits(bw, 1, 1);
      VP8LPutBits(bw, symbols[0], 8);
    }
    if (count == 2) {
      VP8LPutBits(bw, symbols[1], 8);
    }
  } else {
    StoreFullHuffmanCode(bw, huff_tree, tokens, huffman_code);
  }
}